

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O3

int operator<(bdNodeId *a,bdNodeId *b)

{
  uint uVar1;
  long lVar2;
  uint8_t *b_data;
  uint8_t *a_data;
  
  lVar2 = 0;
  do {
    if (a->data[lVar2] < b->data[lVar2]) {
      return 1;
    }
  } while ((a->data[lVar2] <= b->data[lVar2]) &&
          (uVar1 = (uint)lVar2, lVar2 = lVar2 + 1, uVar1 < 0x13));
  return 0;
}

Assistant:

int operator<(const bdNodeId &a, const bdNodeId &b) {
#if 0
	std::cerr <<  "operator<(");
	bdPrintNodeId(std::cerr, &a);
	std::cerr <<  ",";
	bdPrintNodeId(std::cerr, &b);
	std::cerr <<  ")" << std::endl;
#endif
	
	uint8_t *a_data = (uint8_t *) a.data;
	uint8_t *b_data = (uint8_t *) b.data;
	for (int i = 0; i < BITDHT_KEY_LEN; i++)
	{
		if (*a_data < *b_data) {
			//fprintf(stderr, "Return 1, at i = %d\n", i);
			return 1;
		}
		else if (*a_data > *b_data) {
			//fprintf(stderr, "Return 0, at i = %d\n", i);
			return 0;
		}
		a_data++;
		b_data++;
	}
	//fprintf(stderr, "Return 0, at i = KEYLEN\n");
	return 0;
}